

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.hpp
# Opt level: O0

void __thiscall
CorUnix::CSharedMemoryObject::CSharedMemoryObject
          (CSharedMemoryObject *this,CObjectType *pot,CRITICAL_SECTION *pcsObjListLock)

{
  CRITICAL_SECTION *pcsObjListLock_local;
  CObjectType *pot_local;
  CSharedMemoryObject *this_local;
  
  CPalObjectBase::CPalObjectBase(&this->super_CPalObjectBase,pot);
  (this->super_CPalObjectBase).super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_0047f9a8;
  this->m_pcsObjListLock = pcsObjListLock;
  this->m_shmod = 0;
  this->m_pvSharedData = (VOID *)0x0;
  CSimpleSharedMemoryLock::CSimpleSharedMemoryLock(&this->m_ssmlSharedData);
  CSimpleDataLock::CSimpleDataLock(&this->m_sdlSharedData);
  this->m_ObjectDomain = ProcessLocalObject;
  this->m_fSharedDataDereferenced = 0;
  this->m_fDeleteSharedData = 0;
  (this->m_le).Blink = &this->m_le;
  (this->m_le).Flink = &this->m_le;
  return;
}

Assistant:

CSharedMemoryObject(
            CObjectType *pot,
            CRITICAL_SECTION *pcsObjListLock
            )
            :
            CPalObjectBase(pot),
            m_pcsObjListLock(pcsObjListLock),
            m_shmod(SHMNULL),
            m_pvSharedData(NULL),
            m_ObjectDomain(ProcessLocalObject),
            m_fSharedDataDereferenced(FALSE),
            m_fDeleteSharedData(FALSE)
        {
            InitializeListHead(&m_le);
        }